

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O1

void wwRepW(word *a,size_t n,word w)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  word *pwVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar3 = _DAT_001542b0;
  auVar2 = _DAT_00154290;
  if (n != 0) {
    lVar1 = n - 1;
    auVar6._8_4_ = (int)lVar1;
    auVar6._0_8_ = lVar1;
    auVar6._12_4_ = (int)((ulong)lVar1 >> 0x20);
    pwVar4 = a + (n - 1);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_001542b0;
    do {
      auVar7._8_4_ = (int)uVar5;
      auVar7._0_8_ = uVar5;
      auVar7._12_4_ = (int)(uVar5 >> 0x20);
      auVar7 = (auVar7 | auVar2) ^ auVar3;
      if ((bool)(~(auVar7._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar7._0_4_ ||
                  auVar6._4_4_ < auVar7._4_4_) & 1)) {
        *pwVar4 = w;
      }
      if ((auVar7._12_4_ != auVar6._12_4_ || auVar7._8_4_ <= auVar6._8_4_) &&
          auVar7._12_4_ <= auVar6._12_4_) {
        pwVar4[-1] = w;
      }
      uVar5 = uVar5 + 2;
      pwVar4 = pwVar4 + -2;
    } while ((n + 1 & 0xfffffffffffffffe) != uVar5);
  }
  return;
}

Assistant:

void wwRepW(word a[], size_t n, register word w)
{
	ASSERT(wwIsValid(a, n));
	if (n)
		for (; n--; a[n] = w);
	else
		ASSERT(w == 0);
	w = 0;
}